

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::set_empty_key(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *this,key_type *key)

{
  size_type sVar1;
  int *piVar2;
  pair<int,_int> pVar3;
  int iVar4;
  undefined1 auVar5 [16];
  pointer ppVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  (this->settings).
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_empty_ =
       true;
  iVar4 = key->second;
  (this->key_info).empty_key.first = key->first;
  (this->key_info).empty_key.second = iVar4;
  sVar1 = this->num_buckets;
  piVar2 = (this->val_info).
           super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_;
  if (piVar2 != (int *)0x0) {
    *piVar2 = *piVar2 + 1;
  }
  ppVar6 = (pointer)malloc(sVar1 * 8);
  this->table = ppVar6;
  auVar5 = _DAT_00a9a9a0;
  if (sVar1 != 0) {
    pVar3.first = (this->key_info).empty_key.first;
    pVar3.second = (this->key_info).empty_key.second;
    lVar8 = sVar1 - 1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00a9a9a0;
    auVar10 = _DAT_00a9a990;
    do {
      auVar11 = auVar10 ^ auVar5;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        ppVar6[uVar7] = pVar3;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        ppVar6[uVar7 + 1] = pVar3;
      }
      uVar7 = uVar7 + 2;
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
    } while ((sVar1 + 1 & 0xfffffffffffffffe) != uVar7);
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }